

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_flat_block_finder_init
              (aom_flat_block_finder_t *block_finder,int block_size,int bit_depth,int use_highbd)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  undefined4 in_ECX;
  long lVar4;
  byte in_DL;
  uint in_ESI;
  undefined8 *in_RDI;
  double dVar5;
  int row;
  double coords [3];
  double xd;
  double yd;
  int j;
  int i;
  int y;
  int x;
  double *A;
  double *AtA_inv;
  aom_equation_system_t eqns;
  int n;
  aom_equation_system_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  double local_88 [2];
  aom_equation_system_t *in_stack_ffffffffffffff88;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long local_40;
  void *local_38;
  long local_30;
  int local_4;
  
  in_RDI[1] = 0;
  *in_RDI = 0;
  iVar1 = equation_system_init(in_stack_ffffffffffffff68,0);
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed to init equation system for block_size=%d\n",(ulong)in_ESI);
    local_4 = 0;
  }
  else {
    pvVar2 = aom_malloc(0x3a4492);
    pvVar3 = aom_malloc(0x3a44a8);
    if ((pvVar2 == (void *)0x0) || (pvVar3 == (void *)0x0)) {
      fprintf(_stderr,"Failed to alloc A or AtA_inv for block_size=%d\n",(ulong)in_ESI);
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      equation_system_free((aom_equation_system_t *)0x3a44fa);
      local_4 = 0;
    }
    else {
      in_RDI[1] = pvVar3;
      *in_RDI = pvVar2;
      *(uint *)((long)in_RDI + 0x14) = in_ESI;
      in_RDI[3] = (double)((1 << (in_DL & 0x1f)) + -1);
      *(undefined4 *)(in_RDI + 4) = in_ECX;
      for (local_58 = 0; local_58 < (int)in_ESI; local_58 = local_58 + 1) {
        dVar5 = ((double)local_58 - (double)(int)in_ESI / 2.0) / ((double)(int)in_ESI / 2.0);
        for (local_54 = 0; local_54 < (int)in_ESI; local_54 = local_54 + 1) {
          local_88[1] = ((double)local_54 - (double)(int)in_ESI / 2.0) / ((double)(int)in_ESI / 2.0)
          ;
          local_88[0] = dVar5;
          in_stack_ffffffffffffff88 = (aom_equation_system_t *)0x3ff0000000000000;
          iVar1 = local_58 * in_ESI + local_54;
          *(double *)((long)pvVar3 + (long)(iVar1 * 3) * 8) = dVar5;
          *(double *)((long)pvVar3 + (long)(iVar1 * 3 + 1) * 8) = local_88[1];
          *(undefined8 *)((long)pvVar3 + (long)(iVar1 * 3 + 2) * 8) = 0x3ff0000000000000;
          for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
            for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
              lVar4 = (long)(local_5c * 3 + local_60);
              *(double *)(local_40 + lVar4 * 8) =
                   local_88[local_5c] * local_88[local_60] + *(double *)(local_40 + lVar4 * 8);
            }
          }
        }
      }
      for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
        memset(local_38,0,0x18);
        *(undefined8 *)((long)local_38 + (long)local_5c * 8) = 0x3ff0000000000000;
        equation_system_solve(in_stack_ffffffffffffff88);
        for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
          *(undefined8 *)((long)pvVar2 + (long)(local_60 * 3 + local_5c) * 8) =
               *(undefined8 *)(local_30 + (long)local_60 * 8);
        }
      }
      equation_system_free((aom_equation_system_t *)0x3a47e2);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int aom_flat_block_finder_init(aom_flat_block_finder_t *block_finder,
                               int block_size, int bit_depth, int use_highbd) {
  const int n = block_size * block_size;
  aom_equation_system_t eqns;
  double *AtA_inv = 0;
  double *A = 0;
  int x = 0, y = 0, i = 0, j = 0;
  block_finder->A = NULL;
  block_finder->AtA_inv = NULL;

  if (!equation_system_init(&eqns, kLowPolyNumParams)) {
    fprintf(stderr, "Failed to init equation system for block_size=%d\n",
            block_size);
    return 0;
  }

  AtA_inv = (double *)aom_malloc(kLowPolyNumParams * kLowPolyNumParams *
                                 sizeof(*AtA_inv));
  A = (double *)aom_malloc(kLowPolyNumParams * n * sizeof(*A));
  if (AtA_inv == NULL || A == NULL) {
    fprintf(stderr, "Failed to alloc A or AtA_inv for block_size=%d\n",
            block_size);
    aom_free(AtA_inv);
    aom_free(A);
    equation_system_free(&eqns);
    return 0;
  }

  block_finder->A = A;
  block_finder->AtA_inv = AtA_inv;
  block_finder->block_size = block_size;
  block_finder->normalization = (1 << bit_depth) - 1;
  block_finder->use_highbd = use_highbd;

  for (y = 0; y < block_size; ++y) {
    const double yd = ((double)y - block_size / 2.) / (block_size / 2.);
    for (x = 0; x < block_size; ++x) {
      const double xd = ((double)x - block_size / 2.) / (block_size / 2.);
      const double coords[3] = { yd, xd, 1 };
      const int row = y * block_size + x;
      A[kLowPolyNumParams * row + 0] = yd;
      A[kLowPolyNumParams * row + 1] = xd;
      A[kLowPolyNumParams * row + 2] = 1;

      for (i = 0; i < kLowPolyNumParams; ++i) {
        for (j = 0; j < kLowPolyNumParams; ++j) {
          eqns.A[kLowPolyNumParams * i + j] += coords[i] * coords[j];
        }
      }
    }
  }

  // Lazy inverse using existing equation solver.
  for (i = 0; i < kLowPolyNumParams; ++i) {
    memset(eqns.b, 0, sizeof(*eqns.b) * kLowPolyNumParams);
    eqns.b[i] = 1;
    equation_system_solve(&eqns);

    for (j = 0; j < kLowPolyNumParams; ++j) {
      AtA_inv[j * kLowPolyNumParams + i] = eqns.x[j];
    }
  }
  equation_system_free(&eqns);
  return 1;
}